

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

QList<unsigned_long_long> * __thiscall
QMultiHash<unsigned_long_long,_QOpenGL2GradientCache::CacheInfo>::keys
          (QList<unsigned_long_long> *__return_storage_ptr__,
          QMultiHash<unsigned_long_long,_QOpenGL2GradientCache::CacheInfo> *this)

{
  Span *pSVar1;
  key_iterator i1;
  key_iterator i2;
  ulong uVar2;
  Data<QHashPrivate::MultiNode<unsigned_long_long,_QOpenGL2GradientCache::CacheInfo>_> *pDVar3;
  size_t sVar4;
  uchar *puVar5;
  long in_FS_OFFSET;
  
  pDVar3 = this->d;
  if (pDVar3 == (Data<QHashPrivate::MultiNode<unsigned_long_long,_QOpenGL2GradientCache::CacheInfo>_>
                 *)0x0) {
LAB_0013d195:
    sVar4 = 0;
    pDVar3 = (Data<QHashPrivate::MultiNode<unsigned_long_long,_QOpenGL2GradientCache::CacheInfo>_> *
             )0x0;
    puVar5 = (uchar *)0x0;
  }
  else {
    pSVar1 = pDVar3->spans;
    if (pSVar1->offsets[0] == 0xff) {
      uVar2 = 1;
      do {
        sVar4 = uVar2;
        if (pDVar3->numBuckets == sVar4) goto LAB_0013d195;
        uVar2 = sVar4 + 1;
      } while (pSVar1[sVar4 >> 7].offsets[(uint)sVar4 & 0x7f] == 0xff);
    }
    else {
      sVar4 = 0;
    }
    puVar5 = pSVar1[sVar4 >> 7].entries[pSVar1[sVar4 >> 7].offsets[(uint)sVar4 & 0x7f]].storage.data
             + 8;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != *(long *)(in_FS_OFFSET + 0x28)) {
    __stack_chk_fail();
  }
  i1.i.i.bucket = sVar4;
  i1.i.i.d = pDVar3;
  i1.i.e = (Chain **)puVar5;
  i2.i.e = (Chain **)0x0;
  i2.i.i.d = (Data<QHashPrivate::MultiNode<unsigned_long_long,_QOpenGL2GradientCache::CacheInfo>_> *
             )0x0;
  i2.i.i.bucket = 0;
  QList<unsigned_long_long>::
  QList<QMultiHash<unsigned_long_long,_QOpenGL2GradientCache::CacheInfo>::key_iterator,_true>
            (__return_storage_ptr__,i1,i2);
  return __return_storage_ptr__;
}

Assistant:

QList<Key> keys() const { return QList<Key>(keyBegin(), keyEnd()); }